

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

Vec_Ptr_t * Nwk_ManRetimeCutBackward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  timespec ts;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pMan->nLatches = nLatches;
  pMan->nTruePis = pMan->nObjs[1] - nLatches;
  pMan->nTruePos = pMan->nObjs[2] - nLatches;
  pVVar10 = pMan->vCis;
  if (0 < pVVar10->nSize) {
    lVar9 = 0;
    do {
      puVar1 = (uint *)((long)pVVar10->pArray[lVar9] + 0x20);
      *puVar1 = *puVar1 | 0x10;
      lVar9 = lVar9 + 1;
      pVVar10 = pMan->vCis;
    } while (lVar9 < pVVar10->nSize);
  }
  if (0 < pMan->nTruePos) {
    lVar9 = 0;
    do {
      if (pMan->vCos->nSize <= lVar9) goto LAB_008de7ba;
      Nwk_ManMarkTfiCone_rec((Nwk_Obj_t *)pMan->vCos->pArray[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pMan->nTruePos);
  }
  pVVar10 = pMan->vObjs;
  if (0 < pVVar10->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar9];
      if (((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x20) & 7) == 3)) &&
         (*(int *)((long)pvVar3 + 0x3c) == 0)) {
        *(uint *)((long)pvVar3 + 0x20) = *(uint *)((long)pvVar3 + 0x20) | 0x10;
      }
      lVar9 = lVar9 + 1;
      pVVar10 = pMan->vObjs;
    } while (lVar9 < pVVar10->nSize);
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    iVar14 = 0;
    do {
      uVar6 = pMan->nTruePos + iVar14;
      if (((int)uVar6 < 0) || (pMan->vCos->nSize <= (int)uVar6)) goto LAB_008de7ba;
      iVar7 = Nwk_ManPushBackwardFast_rec
                        ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar6] + 0x48),
                         (Nwk_Obj_t *)0x0);
      if (iVar7 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar5 = iVar5 + 1;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("Backward: Max-flow = %4d -> ");
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    iVar7 = 0;
    do {
      uVar6 = pMan->nTruePos + iVar7;
      if (((int)uVar6 < 0) || (pMan->vCos->nSize <= (int)uVar6)) goto LAB_008de7ba;
      iVar8 = Nwk_ManPushBackwardBot_rec
                        ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar6] + 0x48),
                         (Nwk_Obj_t *)0x0);
      if (iVar8 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar14 = iVar14 + 1;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("%4d.  ");
  }
  if (0 < iVar14) {
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    if (0 < pMan->nLatches) {
      iVar7 = 0;
      do {
        uVar6 = pMan->nTruePos + iVar7;
        if (((int)uVar6 < 0) || (pMan->vCos->nSize <= (int)uVar6)) goto LAB_008de7ba;
        iVar8 = Nwk_ManPushBackwardBot_rec
                          ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar6] + 0x48),
                           (Nwk_Obj_t *)0x0);
        if (iVar8 != 0) {
          __assert_fail("!RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x23a,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < pMan->nLatches);
    }
  }
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < (iVar14 + iVar5) - 1U) {
    iVar7 = iVar14 + iVar5;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar11 = (void **)0x0;
  }
  else {
    ppvVar11 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar10->pArray = ppvVar11;
  pVVar12 = pMan->vObjs;
  if (0 < pVVar12->nSize) {
    lVar9 = 0;
    do {
      plVar4 = (long *)pVVar12->pArray[lVar9];
      if ((plVar4 != (long *)0x0) && ((int)plVar4[5] == *(int *)(*plVar4 + 0x68) + -2)) {
        if ((*(uint *)(plVar4 + 4) & 0x20) == 0) {
          __assert_fail("Nwk_ObjHasFlow(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x243,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        if ((*(uint *)(plVar4 + 4) & 7) == 2) {
          __assert_fail("!Nwk_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x244,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        uVar6 = pVVar10->nSize;
        uVar2 = pVVar10->nCap;
        if (uVar6 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
            }
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar2 * 2;
            if (iVar5 <= (int)uVar2) goto LAB_008de672;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar10->pArray = ppvVar11;
          pVVar10->nCap = iVar5;
        }
LAB_008de672:
        pVVar10->nSize = uVar6 + 1;
        pVVar10->pArray[(int)uVar6] = plVar4;
      }
      lVar9 = lVar9 + 1;
      pVVar12 = pMan->vObjs;
    } while (lVar9 < pVVar12->nSize);
  }
  lVar9 = (long)pMan->nLatches;
  if (lVar9 < 1) {
    uVar6 = 0;
  }
  else {
    uVar15 = (ulong)(uint)pMan->nTruePos;
    uVar6 = 0;
    do {
      if ((pMan->nTruePos < 0) || (pMan->vCos->nSize <= (int)uVar15)) {
LAB_008de7ba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar4 = (long *)**(long **)((long)pMan->vCos->pArray[uVar15] + 0x48);
      uVar6 = uVar6 + ((int)plVar4[5] == *(int *)(*plVar4 + 0x68) + -2);
      uVar15 = uVar15 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  Nwk_ManCleanMarks(pMan);
  if (fVerbose != 0) {
    iVar5 = 0xa75836;
    printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)(uint)pVVar10->nSize,(ulong)uVar6);
    Abc_Print(iVar5,"%s =","Time");
    iVar14 = 3;
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar9 + lVar13) / 1000000.0);
  }
  return pVVar10;
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutBackward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the CIs, the TFI of POs, and the constant nodes
    Nwk_ManForEachCi( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPoSeq( pMan, pObj, i )
        Nwk_ManMarkTfiCone_rec( pObj );
    Nwk_ManForEachNode( pMan, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 )
            pObj->MarkA = 1;
    // start flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardFast_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++; 
    }
    if ( fVerbose ) 
    printf( "Backward: Max-flow = %4d -> ", Counter );
    // continue flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LI driver
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLiSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
        }
    }
    // count CO drivers
    Counter = 0;
    Nwk_ManForEachLiSeq( pMan, pObj, i )
        if ( Nwk_ObjVisitedBotOnly( Nwk_ObjFanin0(pObj) ) )
            Counter++;
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutBackward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}